

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O0

int uv_fileno(uv_handle_t *handle,uv_os_fd_t *fd)

{
  uv_handle_type local_24;
  int fd_out;
  uv_os_fd_t *fd_local;
  uv_handle_t *handle_local;
  
  switch(handle->type) {
  case UV_NAMED_PIPE:
  case UV_TCP:
  case UV_TTY:
    local_24 = *(uv_handle_type *)&handle[2].close_cb;
    break;
  case UV_POLL:
    local_24 = handle[1].flags;
    break;
  default:
    return -0x16;
  case UV_UDP:
    local_24 = handle[2].type;
  }
  if (((handle->flags & 3) == 0) && (local_24 != ~UV_UNKNOWN_HANDLE)) {
    *fd = local_24;
    handle_local._4_4_ = 0;
  }
  else {
    handle_local._4_4_ = -9;
  }
  return handle_local._4_4_;
}

Assistant:

int uv_fileno(const uv_handle_t* handle, uv_os_fd_t* fd) {
  int fd_out;

  switch (handle->type) {
  case UV_TCP:
  case UV_NAMED_PIPE:
  case UV_TTY:
    fd_out = uv__stream_fd((uv_stream_t*) handle);
    break;

  case UV_UDP:
    fd_out = ((uv_udp_t *) handle)->io_watcher.fd;
    break;

  case UV_POLL:
    fd_out = ((uv_poll_t *) handle)->io_watcher.fd;
    break;

  default:
    return UV_EINVAL;
  }

  if (uv__is_closing(handle) || fd_out == -1)
    return UV_EBADF;

  *fd = fd_out;
  return 0;
}